

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

container_t * container_remove(container_t *c,uint16_t val,uint8_t typecode,uint8_t *new_typecode)

{
  _Bool _Var1;
  int iVar2;
  int card;
  uint8_t *new_typecode_local;
  uint8_t typecode_local;
  array_container_t *paStack_18;
  uint16_t val_local;
  container_t *c_local;
  
  new_typecode_local._5_1_ = typecode;
  new_typecode_local._6_2_ = val;
  paStack_18 = (array_container_t *)c;
  paStack_18 = (array_container_t *)
               get_writable_copy_if_shared(c,(uint8_t *)((long)&new_typecode_local + 5));
  if (new_typecode_local._5_1_ == '\x01') {
    _Var1 = bitset_container_remove((bitset_container_t *)paStack_18,new_typecode_local._6_2_);
    if ((_Var1) &&
       (iVar2 = bitset_container_cardinality((bitset_container_t *)paStack_18), iVar2 < 0x1001)) {
      *new_typecode = '\x02';
      c_local = array_container_from_bitset((bitset_container_t *)paStack_18);
    }
    else {
      *new_typecode = new_typecode_local._5_1_;
      c_local = paStack_18;
    }
  }
  else if (new_typecode_local._5_1_ == '\x02') {
    *new_typecode = '\x02';
    array_container_remove(paStack_18,new_typecode_local._6_2_);
    c_local = paStack_18;
  }
  else {
    if (new_typecode_local._5_1_ != '\x03') {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1236,
                    "container_t *container_remove(container_t *, uint16_t, uint8_t, uint8_t *)");
    }
    run_container_remove((run_container_t *)paStack_18,new_typecode_local._6_2_);
    *new_typecode = '\x03';
    c_local = paStack_18;
  }
  return c_local;
}

Assistant:

static inline container_t *container_remove(
    container_t *c, uint16_t val,
    uint8_t typecode,  // !!! should be second argument?
    uint8_t *new_typecode
){
    c = get_writable_copy_if_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            if (bitset_container_remove(CAST_bitset(c), val)) {
                int card = bitset_container_cardinality(CAST_bitset(c));
                if (card <= DEFAULT_MAX_SIZE) {
                    *new_typecode = ARRAY_CONTAINER_TYPE;
                    return array_container_from_bitset(CAST_bitset(c));
                }
            }
            *new_typecode = typecode;
            return c;
        case ARRAY_CONTAINER_TYPE:
            *new_typecode = typecode;
            array_container_remove(CAST_array(c), val);
            return c;
        case RUN_CONTAINER_TYPE:
            // per Java, no container type adjustments are done (revisit?)
            run_container_remove(CAST_run(c), val);
            *new_typecode = RUN_CONTAINER_TYPE;
            return c;
        default:
            assert(false);
            __builtin_unreachable();
            return NULL;
    }
}